

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O1

void __thiscall
pbrt::ParsedScene::Rotate(ParsedScene *this,Float angle,Float dx,Float dy,Float dz,FileLoc loc)

{
  Float (*paFVar1) [4];
  Transform *pTVar2;
  int i;
  uint i_00;
  float sinTheta;
  float cosTheta;
  string ret;
  Vector3f local_13c;
  Transform local_130;
  Transform local_b0;
  
  if (this->currentApiState == Uninitialized) {
    paFVar1 = local_130.m.m + 1;
    local_130.m.m[0][2] = 0.0;
    local_130.m.m[0][3] = 0.0;
    local_130.m.m[1][0]._0_1_ = 0;
    local_130.m.m[0]._0_8_ = paFVar1;
    detail::stringPrintfRecursive<char_const(&)[7]>
              ((string *)&local_130,"pbrtInit() must be before calling \"%s()\". Ignoring.",
               (char (*) [7])"Rotate");
    Error(&loc,(char *)local_130.m.m[0]._0_8_);
    if ((Float (*) [4])local_130.m.m[0]._0_8_ != paFVar1) {
      operator_delete((void *)local_130.m.m[0]._0_8_,
                      CONCAT71(local_130.m.m[1]._1_7_,local_130.m.m[1][0]._0_1_) + 1);
    }
  }
  else {
    i_00 = 0;
    do {
      if ((this->activeTransformBits >> (i_00 & 0x1f) & 1) != 0) {
        pTVar2 = TransformSet::operator[](&this->curTransform,i_00);
        local_13c.super_Tuple3<pbrt::Vector3,_float>.x = dx;
        local_13c.super_Tuple3<pbrt::Vector3,_float>.y = dy;
        local_13c.super_Tuple3<pbrt::Vector3,_float>.z = dz;
        sinTheta = sinf(angle * 0.017453292);
        cosTheta = cosf(angle * 0.017453292);
        pbrt::Rotate(&local_b0,sinTheta,cosTheta,&local_13c);
        pbrt::Transform::operator*(&local_130,pTVar2,&local_b0);
        pTVar2 = TransformSet::operator[](&this->curTransform,i_00);
        *(undefined8 *)(pTVar2->m).m[0] = local_130.m.m[0]._0_8_;
        *(undefined8 *)((pTVar2->m).m[0] + 2) = local_130.m.m[0]._8_8_;
        *(ulong *)(pTVar2->m).m[1] = CONCAT71(local_130.m.m[1]._1_7_,local_130.m.m[1][0]._0_1_);
        *(undefined8 *)((pTVar2->m).m[1] + 2) = local_130.m.m[1]._8_8_;
        *(undefined8 *)(pTVar2->m).m[2] = local_130.m.m[2]._0_8_;
        *(undefined8 *)((pTVar2->m).m[2] + 2) = local_130.m.m[2]._8_8_;
        *(undefined8 *)(pTVar2->m).m[3] = local_130.m.m[3]._0_8_;
        *(undefined8 *)((pTVar2->m).m[3] + 2) = local_130.m.m[3]._8_8_;
        (pTVar2->mInv).m[0][0] = local_130.mInv.m[0][0];
        (pTVar2->mInv).m[0][1] = local_130.mInv.m[0][1];
        (pTVar2->mInv).m[0][2] = local_130.mInv.m[0][2];
        (pTVar2->mInv).m[0][3] = local_130.mInv.m[0][3];
        (pTVar2->mInv).m[1][0] = local_130.mInv.m[1][0];
        (pTVar2->mInv).m[1][1] = local_130.mInv.m[1][1];
        (pTVar2->mInv).m[1][2] = local_130.mInv.m[1][2];
        (pTVar2->mInv).m[1][3] = local_130.mInv.m[1][3];
        (pTVar2->mInv).m[2][0] = local_130.mInv.m[2][0];
        (pTVar2->mInv).m[2][1] = local_130.mInv.m[2][1];
        (pTVar2->mInv).m[2][2] = local_130.mInv.m[2][2];
        (pTVar2->mInv).m[2][3] = local_130.mInv.m[2][3];
        (pTVar2->mInv).m[3][0] = local_130.mInv.m[3][0];
        (pTVar2->mInv).m[3][1] = local_130.mInv.m[3][1];
        (pTVar2->mInv).m[3][2] = local_130.mInv.m[3][2];
        (pTVar2->mInv).m[3][3] = local_130.mInv.m[3][3];
      }
      i_00 = i_00 + 1;
    } while (i_00 == 1);
  }
  return;
}

Assistant:

void ParsedScene::Rotate(Float angle, Float dx, Float dy, Float dz, FileLoc loc) {
    VERIFY_INITIALIZED("Rotate");
    FOR_ACTIVE_TRANSFORMS(curTransform[i] = curTransform[i] *
                                            pbrt::Rotate(angle, Vector3f(dx, dy, dz));)
}